

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_makeSourcePositionForTokenRange
          (sysbvm_context_t *context,sysbvm_tuple_t sourceCode,sysbvm_tuple_t tokenSequence,
          size_t startIndex,size_t endIndex)

{
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t lastToken;
  sysbvm_tuple_t firstToken;
  size_t endIndex_local;
  size_t startIndex_local;
  sysbvm_tuple_t tokenSequence_local;
  sysbvm_tuple_t sourceCode_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_arraySlice_getSize(tokenSequence);
  if (sVar1 == 0) {
    context_local =
         (sysbvm_context_t *)sysbvm_sourcePosition_createWithIndices(context,sourceCode,0,0);
  }
  else if (startIndex == endIndex) {
    sVar2 = sysbvm_arraySlice_at(tokenSequence,startIndex);
    context_local = (sysbvm_context_t *)sysbvm_token_getSourcePosition(sVar2);
  }
  else {
    sVar2 = sysbvm_arraySlice_at(tokenSequence,startIndex);
    sVar3 = sysbvm_arraySlice_at(tokenSequence,endIndex - 1);
    sVar2 = sysbvm_token_getSourcePosition(sVar2);
    sVar3 = sysbvm_token_getSourcePosition(sVar3);
    context_local = (sysbvm_context_t *)sysbvm_sourcePosition_createWithUnion(context,sVar2,sVar3);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_makeSourcePositionForTokenRange(sysbvm_context_t *context, sysbvm_tuple_t sourceCode, sysbvm_tuple_t tokenSequence, size_t startIndex, size_t endIndex)
{
    if(sysbvm_arraySlice_getSize(tokenSequence) == 0)
        return sysbvm_sourcePosition_createWithIndices(context, sourceCode, 0, 0);

    if(startIndex == endIndex)
        return sysbvm_token_getSourcePosition(sysbvm_arraySlice_at(tokenSequence, startIndex));

    sysbvm_tuple_t firstToken = sysbvm_arraySlice_at(tokenSequence, startIndex);
    sysbvm_tuple_t lastToken = sysbvm_arraySlice_at(tokenSequence, endIndex - 1);
    return sysbvm_sourcePosition_createWithUnion(context, sysbvm_token_getSourcePosition(firstToken), sysbvm_token_getSourcePosition(lastToken));
}